

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_sample_sum_Test::~HistogramTest_sample_sum_Test
          (HistogramTest_sample_sum_Test *this)

{
  HistogramTest_sample_sum_Test *this_local;
  
  ~HistogramTest_sample_sum_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(HistogramTest, sample_sum) {
  Histogram histogram{{1}};
  histogram.Observe(0);
  histogram.Observe(1);
  histogram.Observe(101);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_sum, 102);
}